

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractmodelserialiser.cpp
# Opt level: O2

QList<int> * AbstractModelSerialiser::modelDefaultRoles(void)

{
  QList<int> *in_RDI;
  initializer_list<int> args;
  int local_48 [16];
  
  local_48[0xc] = 0xb;
  local_48[0xd] = 0xc;
  local_48[0xe] = 0x100;
  local_48[8] = 8;
  local_48[9] = 9;
  local_48[10] = 10;
  local_48[0xb] = 0xe;
  local_48[4] = 5;
  local_48[5] = 0xd;
  local_48[6] = 6;
  local_48[7] = 7;
  local_48[0] = 2;
  local_48[1] = 1;
  local_48[2] = 3;
  local_48[3] = 4;
  args._M_len = 0xf;
  args._M_array = local_48;
  QList<int>::QList(in_RDI,args);
  return in_RDI;
}

Assistant:

QList<int> AbstractModelSerialiser::modelDefaultRoles()
{
    return QList<int>{Qt::EditRole,
                      Qt::DecorationRole,
                      Qt::ToolTipRole,
                      Qt::StatusTipRole,
                      Qt::WhatsThisRole,
                      Qt::SizeHintRole,
                      Qt::FontRole,
                      Qt::TextAlignmentRole,
                      Qt::BackgroundRole,
                      Qt::ForegroundRole,
                      Qt::CheckStateRole,
                      Qt::InitialSortOrderRole,
                      Qt::AccessibleTextRole,
                      Qt::AccessibleDescriptionRole,
                      Qt::UserRole};
}